

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::setByteCopy(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  pointer pBVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Cache *this_00;
  
  while( true ) {
    this_00 = this;
    uVar2 = getBlockId(this_00,addr);
    if (uVar2 != 0xffffffff) {
      uVar3 = getOffset(this_00,addr);
      pBVar1 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar1[(int)uVar2].dirty = true;
      *(uint8_t *)
       (*(long *)&pBVar1[(int)uVar2].data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + (ulong)uVar3) = val;
      if (this_00->write_back != false) {
        return;
      }
      writeBlockToLowerLevel
                (this_00,(this_00->blocks).
                         super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                         super__Vector_impl_data._M_start + (int)uVar2,cycles);
      return;
    }
    if (this_00->write_allocate != false) break;
    this = this_00->lower_cache;
    if (this_00->lower_cache == (Cache *)0x0) {
      MemoryManager::setByteNoCache(this_00->memory,addr,val);
      return;
    }
  }
  loadBlockFromLowerLevel(this_00,addr,cycles);
  uVar2 = getBlockId(this_00,addr);
  if (uVar2 != 0xffffffff) {
    uVar3 = getOffset(this_00,addr);
    pBVar1 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar1[(int)uVar2].dirty = true;
    *(uint8_t *)
     (*(long *)&pBVar1[(int)uVar2].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)uVar3) = val;
    return;
  }
  fwrite("Error: data should in top level cache, but it seems not\n",0x38,1,_stderr);
  exit(-1);
}

Assistant:

void Cache::setByteCopy(uint32_t addr, uint8_t val, uint32_t *cycles) {
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        //in cache
        uint32_t offset = this->getOffset(addr);
        this->blocks[block_id].dirty = true;
        this->blocks[block_id].data[offset] = val;
        if (!this->write_back) {
            this->writeBlockToLowerLevel(this->blocks[block_id], cycles);
        }
        return;
    }

    if (!this->write_allocate) {
        if (this->lower_cache == nullptr) {
            this->memory->setByteNoCache(addr, val);
        } else {
            this->lower_cache->setByteCopy(addr, val, cycles);
        }
    } else {
        this->loadBlockFromLowerLevel(addr, cycles);
        if ((block_id = this->getBlockId(addr)) != -1) {
            uint32_t offset = this->getOffset(addr);
            this->blocks[block_id].dirty = true;
            this->blocks[block_id].data[offset] = val;
            return;
        } else {
            fprintf(stderr, "Error: data should in top level cache, but it seems not\n");
            exit(-1);
        }
    }
}